

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_start(fio_start_args args)

{
  ushort uVar1;
  ushort uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  int local_10;
  fio_start_args local_c;
  int i;
  fio_start_args args_local;
  
  local_c = args;
  fio_expected_concurrency(&local_c.threads,&local_c.workers);
  fio_signal_handler_setup();
  fio_data->workers = local_c.workers;
  fio_data->threads = local_c.threads;
  fio_data->active = '\x01';
  fio_data->is_worker = '\0';
  fio_state_callback_force(FIO_CALL_PRE_START);
  if (3 < FIO_LOG_LEVEL) {
    uVar1 = fio_data->workers;
    pcVar3 = "worker";
    if (1 < fio_data->workers) {
      pcVar3 = "workers";
    }
    uVar2 = fio_data->threads;
    pcVar4 = "thread";
    if (1 < fio_data->threads) {
      pcVar4 = "threads";
    }
    pcVar5 = fio_engine();
    FIO_LOG2STDERR("INFO: Server is running %u %s X %u %s with facil.io 0.7.3 (%s)\n* Detected capacity: %d open file limit\n* Root pid: %d\n* Press ^C to stop\n"
                   ,(ulong)uVar1,pcVar3,(ulong)uVar2,pcVar4,pcVar5,fio_data->capa,fio_data->parent);
  }
  if (1 < local_c.workers) {
    local_10 = 0;
    while( true ) {
      bVar6 = false;
      if (local_10 < local_c.workers) {
        bVar6 = fio_data->active != '\0';
      }
      if (!bVar6) break;
      fio_sentinel_task((void *)0x0,(void *)0x0);
      local_10 = local_10 + 1;
    }
  }
  fio_worker_startup();
  fio_worker_cleanup();
  return;
}

Assistant:

void fio_start FIO_IGNORE_MACRO(struct fio_start_args args) {
  fio_expected_concurrency(&args.threads, &args.workers);
  fio_signal_handler_setup();

  fio_data->workers = (uint16_t)args.workers;
  fio_data->threads = (uint16_t)args.threads;
  fio_data->active = 1;
  fio_data->is_worker = 0;

  fio_state_callback_force(FIO_CALL_PRE_START);

  FIO_LOG_INFO(
      "Server is running %u %s X %u %s with facil.io " FIO_VERSION_STRING
      " (%s)\n"
      "* Detected capacity: %d open file limit\n"
      "* Root pid: %d\n"
      "* Press ^C to stop\n",
      fio_data->workers, fio_data->workers > 1 ? "workers" : "worker",
      fio_data->threads, fio_data->threads > 1 ? "threads" : "thread",
      fio_engine(), fio_data->capa, (int)fio_data->parent);

  if (args.workers > 1) {
    for (int i = 0; i < args.workers && fio_data->active; ++i) {
      fio_sentinel_task(NULL, NULL);
    }
  }
  fio_worker_startup();
  fio_worker_cleanup();
}